

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  rc_data *prVar2;
  item *piVar3;
  int iVar4;
  size_type sVar5;
  int8_t *piVar6;
  ulong uVar7;
  value_type *pvVar8;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>_>
  _Var9;
  solver_failure *this_00;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  
  if (r_size < 4) {
    details::fail_fast("Assertion","r_size >= 4",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"453");
  }
  if (bk_max < bk_min) {
    details::fail_fast("Assertion","bk_min <= bk_max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"454");
  }
  *(int *)(this + 100) = bk_min;
  *(int *)(this + 0x68) = bk_max;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
  ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
            *)(this + 0x20),(ulong)(uint)r_size);
  iVar4 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
  if ((char)iVar4 == '\0') {
    this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
    solver_failure::solver_failure(this_00,no_solver_available);
    __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = shared_subvector::emplace((shared_subvector *)this);
  *(size_type *)(this + 0x60) = sVar5;
  if (sVar5 == 0) {
    if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
      *(long *)(this + 0x40) = *(long *)(this + 0x38);
    }
    prVar2 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar11 = *(long *)(this + 0x20);
    for (lVar12 = 0; (ulong)(uint)r_size << 4 != lVar12; lVar12 = lVar12 + 0x10) {
      *(undefined8 *)(lVar11 + lVar12 * 2) = *(undefined8 *)((long)&prVar2->value + lVar12);
      *(undefined4 *)(lVar11 + 0x18 + lVar12 * 2) = *(undefined4 *)((long)&prVar2->id + lVar12);
      iVar4 = *(int *)((long)&prVar2->f + lVar12);
      *(int *)(lVar11 + 0x14 + lVar12 * 2) = iVar4;
      iVar14 = -iVar4;
      if (0 < iVar4) {
        iVar14 = iVar4;
      }
      *(int *)(lVar11 + 0x10 + lVar12 * 2) = iVar14;
      *(undefined4 *)(lVar11 + 0x1c + lVar12 * 2) = 0;
    }
    piVar6 = shared_subvector::element_data((shared_subvector *)this,0);
    std::__fill_n_a<signed_char*,unsigned_int,int>(piVar6,*(undefined4 *)(this + 0x18));
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    lVar11 = *(long *)(this + 0x20);
    lVar12 = *(long *)(this + 0x28);
    iVar4 = *(int *)(this + 100);
    iVar14 = *(int *)(this + 0x68);
    piVar16 = (int *)(lVar11 + 0x14);
    lVar15 = lVar12 - lVar11 >> 5;
    while (bVar17 = lVar15 != 0, lVar15 = lVar15 + -1, bVar17) {
      if (*piVar16 < 0) {
        iVar4 = iVar4 + piVar16[-1];
        iVar14 = iVar14 + piVar16[-1];
        *(int *)(this + 100) = iVar4;
        *(int *)(this + 0x68) = iVar14;
      }
      piVar16 = piVar16 + 8;
    }
    uVar10 = (int)((ulong)(lVar12 - lVar11) >> 5) - 2;
    *(undefined8 *)(lVar12 + -0x18) = *(undefined8 *)(lVar12 + -0x20);
    while( true ) {
      if ((int)uVar10 < 0) break;
      lVar12 = (ulong)uVar10 * 0x20;
      uVar10 = uVar10 - 1;
      *(double *)(lVar11 + 8 + lVar12) =
           *(double *)(lVar11 + 0x28 + lVar12) + *(double *)(lVar11 + lVar12);
    }
    if (iVar14 == iVar4) {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::solve_equality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *)this);
    }
    else {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::solve_inequality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *)this);
    }
    lVar11 = *(long *)(this + 0x20);
    iVar4 = 0;
    uVar7 = *(long *)(this + 0x28) - lVar11;
    for (uVar13 = 0; (uVar7 & 0x1fffffffe0) != uVar13; uVar13 = uVar13 + 0x20) {
      iVar14 = *(int *)(lVar11 + 0x14 + uVar13);
      pvVar8 = shared_subvector::operator[]((shared_subvector *)this,*(int *)(this + 0x60) + iVar4);
      lVar11 = *(long *)(this + 0x20);
      iVar4 = iVar4 + 1;
      *(uint *)(lVar11 + 0x1c + uVar13) = (uint)((*pvVar8 == '\0') != 0 < iVar14);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    piVar3 = *(item **)(this + 0x28);
    lVar11 = *(long *)(this + 0x20);
    prVar2 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar15 = 0;
    lVar12 = (long)piVar3 - lVar11 >> 5;
    while (bVar17 = lVar12 != 0, lVar12 = lVar12 + -1, bVar17) {
      *(undefined8 *)((long)&prVar2->value + lVar15) = *(undefined8 *)(lVar11 + lVar15 * 2);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(lVar11 + 0x14 + lVar15 * 2);
      auVar18 = vshufps_avx(auVar18,auVar18,0xe1);
      uVar1 = vmovlpd_avx(auVar18);
      *(undefined8 *)((long)&prVar2->id + lVar15) = uVar1;
      lVar15 = lVar15 + 0x10;
    }
    if (_Var9._M_current == piVar3) {
      uVar10 = -(uint)(*(int *)(lVar11 + 0x1c) == 0) | r_size;
    }
    else {
      uVar10 = (int)((ulong)((long)_Var9._M_current - lVar11) >> 5) - 1;
    }
    return uVar10;
  }
  details::fail_fast("Assertion","solution == 0u",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                     ,"465");
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }